

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall wabt::SharedValidator::CheckDeclaredFunc(SharedValidator *this,Var *func_var)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  Result RVar3;
  undefined8 in_RAX;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  
  if (func_var->type_ != Index) {
    __assert_fail("is_index()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                  ,0x3a,"Index wabt::Var::index() const");
  }
  _Var2 = (func_var->field_2).index_;
  p_Var1 = &(this->declared_funcs_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->declared_funcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar6]) {
    bVar6 = p_Var5[1]._M_color < _Var2;
    if (!bVar6) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, _Var2 < p_Var4[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    return (Result)Ok;
  }
  RVar3 = PrintError(this,&func_var->loc,"function %u is not declared in any elem sections",
                     (ulong)_Var2,in_RAX);
  return (Result)RVar3.enum_;
}

Assistant:

Result SharedValidator::CheckDeclaredFunc(Var func_var) {
  if (declared_funcs_.count(func_var.index()) == 0) {
    return PrintError(func_var.loc,
                      "function %" PRIindex
                      " is not declared in any elem sections",
                      func_var.index());
  }
  return Result::Ok;
}